

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

ostream * __thiscall wasm::anon_unknown_0::TypePrinter::print(TypePrinter *this,Field *field)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  
  if (field->mutable_ != Immutable) {
    std::operator<<(this->os,"(mut ");
  }
  bVar1 = Field::isPacked(field);
  if (bVar1) {
    if (field->packedType == i16) {
      poVar3 = this->os;
      pcVar2 = "i16";
    }
    else {
      if (field->packedType != i8) {
        handle_unreachable("unexpected packed type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                           ,0x768);
      }
      poVar3 = this->os;
      pcVar2 = "i8";
    }
    std::operator<<(poVar3,pcVar2);
  }
  else {
    print(this,(Type)(field->type).id);
  }
  if (field->mutable_ != Immutable) {
    std::operator<<(this->os,')');
  }
  return this->os;
}

Assistant:

std::ostream& TypePrinter::print(const Field& field) {
  if (field.mutable_) {
    os << "(mut ";
  }
  if (field.isPacked()) {
    auto packedType = field.packedType;
    if (packedType == Field::PackedType::i8) {
      os << "i8";
    } else if (packedType == Field::PackedType::i16) {
      os << "i16";
    } else {
      WASM_UNREACHABLE("unexpected packed type");
    }
  } else {
    print(field.type);
  }
  if (field.mutable_) {
    os << ')';
  }
  return os;
}